

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDynamicHeap.cpp
# Opt level: O3

void __thiscall
Diligent::VulkanDynamicMemoryManager::VulkanDynamicMemoryManager
          (VulkanDynamicMemoryManager *this,IMemoryAllocator *Allocator,RenderDeviceVkImpl *DeviceVk
          ,Uint32 Size,Uint64 CommandQueueMask)

{
  VulkanPhysicalDevice *pVVar1;
  ulong uVar2;
  VulkanLogicalDevice *this_00;
  uint32_t uVar3;
  VkResult VVar4;
  ulong uVar5;
  MemorySizeFormatter<unsigned_int> *Args_1;
  void *pvVar6;
  string msg_1;
  void *Data;
  string msg;
  VkMemoryRequirements MemReqs;
  char (*in_stack_fffffffffffffef8) [2];
  Uint32 local_fc;
  string local_f8;
  VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6> *local_d8;
  VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *local_d0;
  VkMemoryAllocateInfo local_c8;
  Uint8 *local_a0;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  uint32_t *local_68;
  VkMemoryRequirements local_58;
  ulong local_40;
  char local_38 [8];
  
  (this->super_MasterBlockListBasedManager).m_AllocationsMgrMtx.super___mutex_base._M_mutex.__data.
  __list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)
   ((long)&(this->super_MasterBlockListBasedManager).m_AllocationsMgrMtx.super___mutex_base._M_mutex
   + 0x10) = 0;
  (this->super_MasterBlockListBasedManager).m_AllocationsMgrMtx.super___mutex_base._M_mutex.__data.
  __list.__prev = (__pthread_internal_list *)0x0;
  (this->super_MasterBlockListBasedManager).m_AllocationsMgrMtx.super___mutex_base._M_mutex.__align
       = 0;
  *(undefined8 *)
   ((long)&(this->super_MasterBlockListBasedManager).m_AllocationsMgrMtx.super___mutex_base._M_mutex
   + 8) = 0;
  pvVar6 = (void *)(ulong)Size;
  local_88._M_allocated_capacity = local_88._M_allocated_capacity & 0xffffffffffffff00;
  local_fc = Size;
  local_98._0_8_ = Allocator;
  local_98._8_8_ = pvVar6;
  VariableSizeAllocationsManager::VariableSizeAllocationsManager
            (&(this->super_MasterBlockListBasedManager).m_AllocationsMgr,(CreateInfo *)local_98);
  LOCK();
  (this->super_MasterBlockListBasedManager).m_MasterBlockCounter.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  this->m_DeviceVk = DeviceVk;
  local_d0 = &this->m_VkBuffer;
  local_d8 = &this->m_BufferMemory;
  (this->m_VkBuffer).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_VkBuffer).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_VkBuffer).m_VkObject = (VkBuffer_T *)0x0;
  (this->m_BufferMemory).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_BufferMemory).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_BufferMemory).m_VkObject = (VkDeviceMemory_T *)0x0;
  pVVar1 = (DeviceVk->m_PhysicalDevice)._M_t.
           super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           ._M_t.
           super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  uVar5 = *(VkDeviceSize *)((long)&(pVVar1->m_Properties).limits + 0x138);
  uVar2 = *(VkDeviceSize *)((long)&(pVVar1->m_Properties).limits + 0x140);
  if (uVar5 < uVar2) {
    uVar5 = uVar2;
  }
  uVar2 = *(VkDeviceSize *)((long)&(pVVar1->m_Properties).limits + 0x148);
  if (uVar5 <= uVar2) {
    uVar5 = uVar2;
  }
  this->m_DefaultAlignment = uVar5;
  this->m_CommandQueueMask = CommandQueueMask;
  this->m_TotalPeakSize = 0;
  if ((Size & 0x3ff) != 0) {
    local_c8.sType = 0x400;
    FormatString<char[12],unsigned_int,char[48],unsigned_int,char[2]>
              ((string *)local_98,(Diligent *)"Heap size (",(char (*) [12])&local_fc,
               (uint *)" is not aligned by the master block alignment (",(char (*) [48])&local_c8,
               (uint *)0x920060,in_stack_fffffffffffffef8);
    DebugAssertionFailed
              ((Char *)local_98._0_8_,"VulkanDynamicMemoryManager",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanDynamicHeap.cpp"
               ,0x3a);
    if ((IMemoryAllocator *)local_98._0_8_ != (IMemoryAllocator *)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_,local_88._M_allocated_capacity + 1);
    }
    pvVar6 = (void *)(ulong)local_fc;
  }
  local_98._8_8_ = (void *)0x0;
  local_98._0_8_ = (IMemoryAllocator *)0xc;
  local_88._M_allocated_capacity = 0;
  local_78._0_4_ = 0x1f1;
  local_78._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
  uStack_70._0_4_ = 0;
  uStack_70._4_4_ = 0;
  local_68 = (uint32_t *)0x0;
  this_00 = (DeviceVk->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  local_88._8_8_ = pvVar6;
  VulkanUtilities::VulkanLogicalDevice::CreateBuffer
            ((BufferWrapper *)&local_c8,this_00,(VkBufferCreateInfo *)local_98,"Dynamic heap buffer"
            );
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  operator=(local_d0,(VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)
                     &local_c8);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)&local_c8)
  ;
  VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
            (&local_58,this_00,(this->m_VkBuffer).m_VkObject);
  local_c8.pNext = (void *)0x0;
  local_c8.memoryTypeIndex = 0;
  local_c8._28_4_ = 0;
  local_c8.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
  local_c8._4_4_ = 0;
  local_c8.allocationSize = local_58.size;
  uVar3 = VulkanUtilities::VulkanPhysicalDevice::GetMemoryTypeIndex
                    ((DeviceVk->m_PhysicalDevice)._M_t.
                     super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                     .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>.
                     _M_head_impl,local_58.memoryTypeBits,6);
  local_c8.memoryTypeIndex = uVar3;
  if (uVar3 == 0xffffffff) {
    FormatString<char[340]>
              (&local_f8,
               (char (*) [340])
               "Vulkan spec requires that for a VkBuffer not created with the VK_BUFFER_CREATE_SPARSE_BINDING_BIT bit set, the memoryTypeBits member always contains at least one bit set corresponding to a VkMemoryType with a propertyFlags that has both the VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT bit and the VK_MEMORY_PROPERTY_HOST_COHERENT_BIT bit set(11.6)"
              );
    DebugAssertionFailed
              (local_f8._M_dataplus._M_p,"VulkanDynamicMemoryManager",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanDynamicHeap.cpp"
               ,0x60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
  }
  VulkanUtilities::VulkanLogicalDevice::AllocateDeviceMemory
            ((DeviceMemoryWrapper *)&local_f8,this_00,&local_c8,
             "Host-visible memory for upload buffer");
  VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>::
  operator=(local_d8,(VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>
                      *)&local_f8);
  VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6> *)
             &local_f8);
  local_a0 = (Uint8 *)0x0;
  VVar4 = VulkanUtilities::VulkanLogicalDevice::MapMemory
                    (this_00,(this->m_BufferMemory).m_VkObject,0,local_c8.allocationSize,0,&local_a0
                    );
  this->m_CPUAddress = local_a0;
  if (VVar4 != VK_SUCCESS) {
    local_f8._M_dataplus._M_p = VulkanUtilities::VkResultToString(VVar4);
    LogError<true,char[22],char[17],char_const*>
              (false,"VulkanDynamicMemoryManager",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanDynamicHeap.cpp"
               ,0x6d,(char (*) [22])"Failed to map  memory",(char (*) [17])"\nVK Error Code: ",
               (char **)&local_f8);
  }
  Args_1 = (MemorySizeFormatter<unsigned_int> *)0x0;
  VVar4 = VulkanUtilities::VulkanLogicalDevice::BindBufferMemory
                    (this_00,(this->m_VkBuffer).m_VkObject,(this->m_BufferMemory).m_VkObject,0);
  if (VVar4 != VK_SUCCESS) {
    local_f8._M_dataplus._M_p = VulkanUtilities::VkResultToString(VVar4);
    Args_1 = (MemorySizeFormatter<unsigned_int> *)0x70;
    LogError<true,char[29],char[17],char_const*>
              (false,"VulkanDynamicMemoryManager",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanDynamicHeap.cpp"
               ,0x70,(char (*) [29])"Failed to bind buffer memory",
               (char (*) [17])"\nVK Error Code: ",(char **)&local_f8);
  }
  local_40 = (ulong)local_fc | 0x200000000;
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  FormatString<char[46],Diligent::MemorySizeFormatter<unsigned_int>>
            (&local_f8,(Diligent *)"GPU dynamic heap created. Total buffer size: ",
             (char (*) [46])&local_40,Args_1);
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(0,local_f8._M_dataplus._M_p,0,0,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

VulkanDynamicMemoryManager::VulkanDynamicMemoryManager(IMemoryAllocator&   Allocator,
                                                       RenderDeviceVkImpl& DeviceVk,
                                                       Uint32              Size,
                                                       Uint64              CommandQueueMask) :
    // clang-format off
    TBase             {Allocator, Size},
    m_DeviceVk        {DeviceVk},
    m_DefaultAlignment{GetDefaultAlignment(DeviceVk.GetPhysicalDevice())},
    m_CommandQueueMask{CommandQueueMask}
// clang-format on
{
    VERIFY((Size & (MasterBlockAlignment - 1)) == 0, "Heap size (", Size, " is not aligned by the master block alignment (", Uint32{MasterBlockAlignment}, ")");

    VkBufferCreateInfo VkBuffCI{};
    VkBuffCI.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
    VkBuffCI.pNext = nullptr;
    VkBuffCI.flags = 0; // VK_BUFFER_CREATE_SPARSE_BINDING_BIT, VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT, VK_BUFFER_CREATE_SPARSE_ALIASED_BIT
    VkBuffCI.size  = Size;
    VkBuffCI.usage =
        VK_BUFFER_USAGE_TRANSFER_SRC_BIT |
        VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT |
        VK_BUFFER_USAGE_STORAGE_BUFFER_BIT |
        VK_BUFFER_USAGE_INDEX_BUFFER_BIT |
        VK_BUFFER_USAGE_VERTEX_BUFFER_BIT |
        VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT;
    VkBuffCI.sharingMode           = VK_SHARING_MODE_EXCLUSIVE;
    VkBuffCI.queueFamilyIndexCount = 0;
    VkBuffCI.pQueueFamilyIndices   = nullptr;

    const auto& LogicalDevice    = DeviceVk.GetLogicalDevice();
    m_VkBuffer                   = LogicalDevice.CreateBuffer(VkBuffCI, "Dynamic heap buffer");
    VkMemoryRequirements MemReqs = LogicalDevice.GetBufferMemoryRequirements(m_VkBuffer);

    const auto& PhysicalDevice = DeviceVk.GetPhysicalDevice();

    VkMemoryAllocateInfo MemAlloc{};
    MemAlloc.pNext          = nullptr;
    MemAlloc.sType          = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
    MemAlloc.allocationSize = MemReqs.size;

    // VK_MEMORY_PROPERTY_HOST_COHERENT_BIT bit specifies that the host cache management commands vkFlushMappedMemoryRanges
    // and vkInvalidateMappedMemoryRanges are NOT needed to flush host writes to the device or make device writes visible
    // to the host (10.2)
    MemAlloc.memoryTypeIndex = PhysicalDevice.GetMemoryTypeIndex(MemReqs.memoryTypeBits, VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT | VK_MEMORY_PROPERTY_HOST_COHERENT_BIT);

    VERIFY(MemAlloc.memoryTypeIndex != VulkanUtilities::VulkanPhysicalDevice::InvalidMemoryTypeIndex,
           "Vulkan spec requires that for a VkBuffer not created with the "
           "VK_BUFFER_CREATE_SPARSE_BINDING_BIT bit set, the memoryTypeBits member always contains at least one bit set "
           "corresponding to a VkMemoryType with a propertyFlags that has both the VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT bit "
           "and the VK_MEMORY_PROPERTY_HOST_COHERENT_BIT bit set(11.6)");

    m_BufferMemory = LogicalDevice.AllocateDeviceMemory(MemAlloc, "Host-visible memory for upload buffer");

    void* Data = nullptr;

    auto err = LogicalDevice.MapMemory(
        m_BufferMemory,
        0, // offset
        MemAlloc.allocationSize,
        0, // flags, reserved for future use
        &Data);
    m_CPUAddress = reinterpret_cast<Uint8*>(Data);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to map  memory");

    err = LogicalDevice.BindBufferMemory(m_VkBuffer, m_BufferMemory, 0 /*offset*/);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to bind buffer memory");

    LOG_INFO_MESSAGE("GPU dynamic heap created. Total buffer size: ", FormatMemorySize(Size, 2));
}